

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O0

void __thiscall
Diligent::QueryBase<Diligent::EngineVkImplTraits>::QueryBase
          (QueryBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,QueryDesc *Desc,bool bIsDeviceInternal)

{
  RenderDeviceVkImpl *this_00;
  DeviceFeatures *pDVar1;
  Char *Message;
  undefined1 local_68 [8];
  string msg;
  DeviceFeatures *Features;
  bool bIsDeviceInternal_local;
  QueryDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  QueryBase<Diligent::EngineVkImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>).
  super_ObjectBase<Diligent::IQueryVk>.super_RefCountedObject<Diligent::IQueryVk>.super_IQueryVk.
  super_IQuery.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_010d2a08;
  RefCntAutoPtr<Diligent::DeviceContextVkImpl>::RefCntAutoPtr(&this->m_pContext);
  this->m_State = Inactive;
  this_00 = DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                       );
  pDVar1 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  switch(Desc->Type) {
  case QUERY_TYPE_OCCLUSION:
    if (pDVar1->OcclusionQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[51]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x53,(char (*) [51])"Occlusion queries are not supported by this device");
    }
    break;
  case QUERY_TYPE_BINARY_OCCLUSION:
    if (pDVar1->BinaryOcclusionQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[58]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x58,(char (*) [58])"Binary occlusion queries are not supported by this device");
    }
    break;
  case QUERY_TYPE_TIMESTAMP:
    if (pDVar1->TimestampQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[51]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x5d,(char (*) [51])"Timestamp queries are not supported by this device");
    }
    break;
  case QUERY_TYPE_PIPELINE_STATISTICS:
    if (pDVar1->PipelineStatisticsQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[61]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x62,(char (*) [61])"Pipeline statistics queries are not supported by this device"
                );
    }
    break;
  case QUERY_TYPE_DURATION:
    if (pDVar1->DurationQueries == DEVICE_FEATURE_STATE_DISABLED) {
      LogError<true,char[50]>
                (false,"QueryBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0x67,(char (*) [50])"Duration queries are not supported by this device");
    }
    break;
  default:
    FormatString<char[22]>((string *)local_68,(char (*) [22])"Unexpected query type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"QueryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0x6b);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

QueryBase(IReferenceCounters*   pRefCounters,
              RenderDeviceImplType* pDevice,
              const QueryDesc&      Desc,
              bool                  bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        const DeviceFeatures& Features = this->GetDevice()->GetFeatures();
        static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below");
        switch (Desc.Type)
        {
            case QUERY_TYPE_OCCLUSION:
                if (!Features.OcclusionQueries)
                    LOG_ERROR_AND_THROW("Occlusion queries are not supported by this device");
                break;

            case QUERY_TYPE_BINARY_OCCLUSION:
                if (!Features.BinaryOcclusionQueries)
                    LOG_ERROR_AND_THROW("Binary occlusion queries are not supported by this device");
                break;

            case QUERY_TYPE_TIMESTAMP:
                if (!Features.TimestampQueries)
                    LOG_ERROR_AND_THROW("Timestamp queries are not supported by this device");
                break;

            case QUERY_TYPE_PIPELINE_STATISTICS:
                if (!Features.PipelineStatisticsQueries)
                    LOG_ERROR_AND_THROW("Pipeline statistics queries are not supported by this device");
                break;

            case QUERY_TYPE_DURATION:
                if (!Features.DurationQueries)
                    LOG_ERROR_AND_THROW("Duration queries are not supported by this device");
                break;

            default:
                UNEXPECTED("Unexpected query type");
        }
    }